

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_01;
  float fVar1;
  int iVar2;
  ulong uVar3;
  Layer *pLVar4;
  int iVar5;
  int g;
  long lVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  Mat weight_data_g;
  Mat int8_weight_data;
  Mat int8_weight_data_g;
  Option opt_q;
  ParamDict pd;
  
  sVar7 = (this->weight_data).elemsize;
  if (sVar7 == 1) {
    bVar9 = true;
    if ((opt->use_int8_inference & 1U) == 0) {
      fwrite("quantized int8 weight loaded but use_int8_inference disabled\n",0x3d,1,_stderr);
      return -1;
    }
  }
  else if ((~opt->use_int8_inference & 1U) == 0 && sVar7 == 4) {
    bVar9 = this->int8_scale_term != 0;
  }
  else {
    bVar9 = false;
  }
  this->use_int8_inference = bVar9;
  if ((~bVar9 & 1U) == 0 && sVar7 == 4) {
    Mat::Mat(&int8_weight_data,this->weight_data_size,1,(Allocator *)0x0);
    if ((int8_weight_data.data == (void *)0x0) ||
       ((long)int8_weight_data.c * int8_weight_data.cstep == 0)) {
      Mat::~Mat(&int8_weight_data);
      return -100;
    }
    iVar5 = this->group;
    iVar2 = this->weight_data_size / iVar5;
    sVar7 = (size_t)iVar2;
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < iVar5; lVar8 = lVar8 + 1) {
      pLVar4 = create_layer(0x39);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,*(float *)((long)(this->weight_data_int8_scales).data + lVar8 * 4));
      (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
      (*pLVar4->_vptr_Layer[4])(pLVar4,opt);
      opt_q.lightmode = opt->lightmode;
      opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_q.num_threads = opt->num_threads;
      opt_q.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
      opt_q.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
      opt_q.use_winograd_convolution = opt->use_winograd_convolution;
      opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_q.use_int8_inference = opt->use_int8_inference;
      opt_q.use_vulkan_compute = opt->use_vulkan_compute;
      opt_q.use_fp16_packed = opt->use_fp16_packed;
      opt_q.use_fp16_storage = opt->use_fp16_storage;
      opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_q.use_int8_storage = opt->use_int8_storage;
      opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_q.use_packing_layout = opt->use_packing_layout;
      opt_q._34_6_ = *(undefined6 *)&opt->field_0x22;
      opt_q.blob_allocator = int8_weight_data.allocator;
      weight_data_g.elemsize = (this->weight_data).elemsize;
      weight_data_g.data = (void *)(weight_data_g.elemsize * lVar6 + (long)(this->weight_data).data)
      ;
      weight_data_g.elempack = (this->weight_data).elempack;
      weight_data_g.allocator = (this->weight_data).allocator;
      weight_data_g.refcount = (int *)0x0;
      int8_weight_data_g.dims = 1;
      weight_data_g.w = iVar2;
      weight_data_g.dims = 1;
      weight_data_g.h = 1;
      weight_data_g.c = 1;
      int8_weight_data_g.data =
           (void *)(CONCAT44(int8_weight_data.elemsize._4_4_,(undefined4)int8_weight_data.elemsize)
                    * lVar6 + (long)int8_weight_data.data);
      int8_weight_data_g.refcount = (int *)0x0;
      int8_weight_data_g.elempack = int8_weight_data.elempack;
      int8_weight_data_g.allocator = int8_weight_data.allocator;
      int8_weight_data_g.h = 1;
      int8_weight_data_g.c = 1;
      weight_data_g.cstep = sVar7;
      int8_weight_data_g.w = iVar2;
      int8_weight_data_g.cstep = sVar7;
      (*pLVar4->_vptr_Layer[7])(pLVar4,&weight_data_g,&int8_weight_data_g,&opt_q);
      (*pLVar4->_vptr_Layer[1])(pLVar4);
      Mat::~Mat(&int8_weight_data_g);
      Mat::~Mat(&weight_data_g);
      ParamDict::~ParamDict(&pd);
      iVar5 = this->group;
      lVar6 = lVar6 + sVar7;
    }
    Mat::operator=(&this->weight_data,&int8_weight_data);
    Mat::~Mat(&int8_weight_data);
    bVar9 = (bool)(this->use_int8_inference & 1);
  }
  if (bVar9 != false) {
    this_00 = &this->quantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_00,(long)this->group);
    this_01 = &this->dequantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_01,(long)this->group);
    for (lVar6 = 0; uVar3 = (ulong)this->group, lVar6 < (long)uVar3; lVar6 = lVar6 + 1) {
      pLVar4 = create_layer(0x39);
      (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
      .super__Vector_impl_data._M_start[lVar6] = pLVar4;
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,*(float *)((long)(this->bottom_blob_int8_scales).data + lVar6 * 4));
      pLVar4 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
      (*(this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar6]->_vptr_Layer[4])();
      ParamDict::~ParamDict(&pd);
    }
    for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
      pLVar4 = create_layer(0x3a);
      (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = pLVar4;
      fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar6 * 4);
      fVar10 = 0.0;
      if (fVar1 != 0.0) {
        fVar10 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales).data + lVar6 * 4));
      }
      int8_weight_data_g.data =
           (void *)CONCAT44((int)((ulong)int8_weight_data_g.data >> 0x20),fVar10);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,int8_weight_data_g.data._0_4_);
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,1);
      pLVar4 = (this_01->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      (*pLVar4->_vptr_Layer[2])(pLVar4,&pd);
      int8_weight_data.elemsize._0_4_ = 0;
      int8_weight_data.elemsize._4_4_ = 0;
      int8_weight_data.elempack = 0;
      int8_weight_data.data = (void *)0x0;
      int8_weight_data.refcount._0_4_ = 0;
      int8_weight_data.refcount._4_4_ = 0;
      int8_weight_data.h = 0;
      int8_weight_data.c = 0;
      int8_weight_data.cstep = 0;
      int8_weight_data.allocator = (Allocator *)0x0;
      int8_weight_data.dims = 0;
      int8_weight_data.w = 0;
      weight_data_g.elemsize = (this->bias_data).elemsize;
      weight_data_g.data = (void *)(weight_data_g.elemsize * lVar6 + (long)(this->bias_data).data);
      weight_data_g.elempack = (this->bias_data).elempack;
      weight_data_g.allocator = (this->bias_data).allocator;
      weight_data_g.refcount = (int *)0x0;
      weight_data_g.dims = 1;
      weight_data_g.w = 1;
      weight_data_g.h = 1;
      weight_data_g.c = 1;
      weight_data_g.cstep = 1;
      Mat::operator=(&int8_weight_data,&weight_data_g);
      Mat::~Mat(&weight_data_g);
      pLVar4 = (this_01->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)&weight_data_g,&int8_weight_data);
      (*pLVar4->_vptr_Layer[3])(pLVar4,&weight_data_g);
      ModelBin::~ModelBin((ModelBin *)&weight_data_g);
      pLVar4 = (this_01->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      (*pLVar4->_vptr_Layer[4])(pLVar4,opt);
      std::vector<float,_std::allocator<float>_>::push_back
                (&this->dequantize_scales,(value_type_conflict1 *)&int8_weight_data_g);
      Mat::~Mat(&int8_weight_data);
      ParamDict::~ParamDict(&pd);
      uVar3 = (ulong)(uint)this->group;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);

            quantize_ops[g]->create_pipeline(opt);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;
            if (weight_data_int8_scales[g] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));

            dequantize_ops[g]->create_pipeline(opt);

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}